

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

int64_t celero::GetRAMSystemUsedByCurrentProcess(void)

{
  int64_t iVar1;
  int64_t iVar2;
  
  iVar1 = GetRAMPhysicalUsedByCurrentProcess();
  iVar2 = GetRAMVirtualUsedByCurrentProcess();
  return iVar2 + iVar1;
}

Assistant:

int64_t celero::GetRAMSystemUsedByCurrentProcess()
{
#ifdef _WIN32
	PROCESS_MEMORY_COUNTERS_EX pmc;
	GetProcessMemoryInfo(GetCurrentProcess(), reinterpret_cast<PPROCESS_MEMORY_COUNTERS>(&pmc), sizeof(pmc));
	return static_cast<int64_t>(pmc.WorkingSetSize);
#else
	return celero::GetRAMPhysicalUsedByCurrentProcess() + celero::GetRAMVirtualUsedByCurrentProcess();
#endif
}